

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O1

bool __thiscall
cmFileInstaller::Parse
          (cmFileInstaller *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmExecutionStatus *pcVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  size_type __rlen;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>
  __l;
  string install_mode;
  string e;
  allocator_type local_d1;
  string local_d0;
  char *local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined4 local_90;
  undefined8 local_88;
  char *local_80;
  undefined4 local_78;
  undefined8 local_70;
  char *local_68;
  undefined4 local_60;
  undefined8 local_58;
  char *local_50;
  undefined4 local_48;
  string local_40;
  
  bVar4 = cmFileCopier::Parse(&this->super_cmFileCopier,args);
  if (!bVar4) {
    return false;
  }
  if ((this->Rename)._M_string_length != 0) {
    if ((this->super_cmFileCopier).FilesFromDir._M_string_length != 0) {
      pcVar1 = (this->super_cmFileCopier).Status;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "INSTALL option RENAME may not be combined with FILES_FROM_DIR.","");
      std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
      goto LAB_0054902c;
    }
    if ((*(uint *)&(this->super_cmFileCopier).field_0xf4 & 0xfffffffe) != 4) {
      pcVar1 = (this->super_cmFileCopier).Status;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "INSTALL option RENAME may be used only with FILES or PROGRAMS.","");
      std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
      goto LAB_0054902c;
    }
    if (0x20 < (ulong)((long)(this->super_cmFileCopier).Files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_cmFileCopier).Files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      pcVar1 = (this->super_cmFileCopier).Status;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"INSTALL option RENAME may be used only with one file.","");
      std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
      goto LAB_0054902c;
    }
  }
  bVar4 = HandleInstallDestination(this);
  if (!bVar4) {
    return false;
  }
  if (1 < (byte)(this->MessageLazy + this->MessageAlways + this->MessageNever)) {
    pcVar1 = (this->super_cmFileCopier).Status;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "INSTALL options MESSAGE_ALWAYS, MESSAGE_LAZY, and MESSAGE_NEVER are mutually exclusive."
               ,"");
    std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
LAB_0054902c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT44(local_d0.field_2._M_allocated_capacity._4_4_,
                               local_d0.field_2._M_allocated_capacity._0_4_) + 1);
    }
    return false;
  }
  if ((Parse(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::
       install_mode_dict == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Parse(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::install_mode_dict), iVar5 != 0)) {
    local_d0._M_dataplus._M_p = (pointer)0xb;
    local_d0._M_string_length = 0x8e6879;
    local_d0.field_2._M_allocated_capacity._0_4_ = 1;
    local_d0.field_2._8_8_ = 0x13;
    local_b0 = "ABS_SYMLINK_OR_COPY";
    local_a8 = 2;
    local_a0 = 0xb;
    local_98 = "REL_SYMLINK";
    local_90 = 3;
    local_88 = 0x13;
    local_80 = "REL_SYMLINK_OR_COPY";
    local_78 = 4;
    local_70 = 7;
    local_68 = "SYMLINK";
    local_60 = 5;
    local_58 = 0xf;
    local_50 = "SYMLINK_OR_COPY";
    local_48 = 6;
    __l._M_len = 6;
    __l._M_array = (iterator)&local_d0;
    std::
    map<std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>_>
    ::map(&Parse::install_mode_dict,__l,
          (less<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_40,&local_d1);
    __cxa_atexit(std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>_>
                 ::~map,&Parse::install_mode_dict,&__dso_handle);
    __cxa_guard_release(&Parse(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::install_mode_dict);
  }
  local_d0._M_string_length = 0;
  local_d0.field_2._M_allocated_capacity._0_4_ =
       local_d0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  cmsys::SystemTools::GetEnv("CMAKE_INSTALL_MODE",&local_d0);
  sVar3 = local_d0._M_string_length;
  _Var2._M_p = local_d0._M_dataplus._M_p;
  if (((pointer)local_d0._M_string_length == (pointer)0x0) ||
     (((pointer)local_d0._M_string_length == (pointer)0x4 &&
      (iVar5 = bcmp(local_d0._M_dataplus._M_p,"COPY",4), iVar5 == 0)))) {
    this->InstallMode = COPY;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)sVar3;
    local_40._M_string_length = (size_type)_Var2._M_p;
    cVar6 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmInstallMode>_>_>
            ::find(&Parse::install_mode_dict._M_t,(key_type *)&local_40);
    if ((_Rb_tree_header *)cVar6._M_node ==
        &Parse::install_mode_dict._M_t._M_impl.super__Rb_tree_header) {
      cmStrCat<char_const(&)[21],std::__cxx11::string&,char_const(&)[46]>
                (&local_40,(char (*) [21])"Unrecognized value \'",&local_d0,
                 (char (*) [46])"\' for environment variable CMAKE_INSTALL_MODE");
      std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      this->InstallMode = *(cmInstallMode *)&cVar6._M_node[1]._M_left;
    }
    if ((_Rb_tree_header *)cVar6._M_node ==
        &Parse::install_mode_dict._M_t._M_impl.super__Rb_tree_header) {
      bVar4 = false;
      goto LAB_00549157;
    }
  }
  bVar4 = true;
LAB_00549157:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT44(local_d0.field_2._M_allocated_capacity._4_4_,
                             local_d0.field_2._M_allocated_capacity._0_4_) + 1);
    return bVar4;
  }
  return bVar4;
}

Assistant:

bool cmFileInstaller::Parse(std::vector<std::string> const& args)
{
  if (!this->cmFileCopier::Parse(args)) {
    return false;
  }

  if (!this->Rename.empty()) {
    if (!this->FilesFromDir.empty()) {
      this->Status.SetError("INSTALL option RENAME may not be "
                            "combined with FILES_FROM_DIR.");
      return false;
    }
    if (this->InstallType != cmInstallType_FILES &&
        this->InstallType != cmInstallType_PROGRAMS) {
      this->Status.SetError("INSTALL option RENAME may be used "
                            "only with FILES or PROGRAMS.");
      return false;
    }
    if (this->Files.size() > 1) {
      this->Status.SetError("INSTALL option RENAME may be used "
                            "only with one file.");
      return false;
    }
  }

  if (!this->HandleInstallDestination()) {
    return false;
  }

  if (((this->MessageAlways ? 1 : 0) + (this->MessageLazy ? 1 : 0) +
       (this->MessageNever ? 1 : 0)) > 1) {
    this->Status.SetError("INSTALL options MESSAGE_ALWAYS, "
                          "MESSAGE_LAZY, and MESSAGE_NEVER "
                          "are mutually exclusive.");
    return false;
  }

  static const std::map<cm::string_view, cmInstallMode> install_mode_dict{
    { "ABS_SYMLINK"_s, cmInstallMode::ABS_SYMLINK },
    { "ABS_SYMLINK_OR_COPY"_s, cmInstallMode::ABS_SYMLINK_OR_COPY },
    { "REL_SYMLINK"_s, cmInstallMode::REL_SYMLINK },
    { "REL_SYMLINK_OR_COPY"_s, cmInstallMode::REL_SYMLINK_OR_COPY },
    { "SYMLINK"_s, cmInstallMode::SYMLINK },
    { "SYMLINK_OR_COPY"_s, cmInstallMode::SYMLINK_OR_COPY }
  };

  std::string install_mode;
  cmSystemTools::GetEnv("CMAKE_INSTALL_MODE", install_mode);
  if (install_mode.empty() || install_mode == "COPY"_s) {
    this->InstallMode = cmInstallMode::COPY;
  } else {
    auto it = install_mode_dict.find(install_mode);
    if (it != install_mode_dict.end()) {
      this->InstallMode = it->second;
    } else {
      auto e = cmStrCat("Unrecognized value '", install_mode,
                        "' for environment variable CMAKE_INSTALL_MODE");
      this->Status.SetError(e);
      return false;
    }
  }

  return true;
}